

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_escape_sequence<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  char_type_conflict cVar1;
  bool bVar2;
  char_type_conflict cVar3;
  context<toml::type_config> *in_RDX;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *in_RDI;
  string escape_seqs;
  source_location src_3;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8_2;
  source_location src_2;
  region reg_2;
  sequence scanner_2;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8_1;
  source_location src_1;
  region reg_1;
  sequence scanner_1;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8;
  source_location src;
  region reg;
  sequence scanner;
  string_type retval;
  spec *spec;
  source_location *in_stack_fffffffffffff088;
  failure_type *f;
  source_location *in_stack_fffffffffffff090;
  size_t in_stack_fffffffffffff098;
  location *in_stack_fffffffffffff0a0;
  character *in_stack_fffffffffffff0a8;
  sequence *in_stack_fffffffffffff0b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0b8;
  allocator<char> *in_stack_fffffffffffff0c0;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0d0;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *in_stack_fffffffffffff0e8;
  error_info *v;
  source_location in_stack_fffffffffffff0f0;
  source_location loc_00;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  region *in_stack_fffffffffffff100;
  region *in_stack_fffffffffffff108;
  source_location *in_stack_fffffffffffff110;
  location *in_stack_fffffffffffff180;
  sequence *in_stack_fffffffffffff188;
  allocator<char> local_df9 [65];
  string *in_stack_fffffffffffff248;
  source_location *in_stack_fffffffffffff250;
  undefined8 in_stack_fffffffffffff258;
  failure_type local_d80;
  allocator<char> local_d21 [257];
  undefined **local_c20;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_bc0;
  allocator<char> local_b59 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab9 [12];
  region *in_stack_fffffffffffff6c8;
  allocator<char> local_8a0 [112];
  undefined **local_830;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_7d0;
  allocator<char> local_769 [160];
  error_info local_6c9 [6];
  hexdig local_4b0 [2];
  undefined **local_440;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_3e0;
  uint local_380;
  allocator<char> local_379 [160];
  allocator<char> local_2d9 [697];
  spec *local_20;
  
  local_20 = context<toml::type_config>::toml_spec(in_RDX);
  location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0a0);
  cVar1 = location::current((location *)in_stack_fffffffffffff088);
  if (cVar1 == '\\') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38));
    location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  }
  else {
    cVar1 = location::current((location *)in_stack_fffffffffffff088);
    if (cVar1 == '\"') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38));
      location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
    }
    else {
      cVar1 = location::current((location *)in_stack_fffffffffffff088);
      if (cVar1 == 'b') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38));
        location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
      }
      else {
        cVar1 = location::current((location *)in_stack_fffffffffffff088);
        if (cVar1 == 'f') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38));
          location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
        }
        else {
          cVar1 = location::current((location *)in_stack_fffffffffffff088);
          if (cVar1 == 'n') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38));
            location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
          }
          else {
            cVar1 = location::current((location *)in_stack_fffffffffffff088);
            if (cVar1 == 'r') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff090,(char)((ulong)in_stack_fffffffffffff088 >> 0x38))
              ;
              location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
            }
            else {
              cVar1 = location::current((location *)in_stack_fffffffffffff088);
              if (cVar1 == 't') {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff090,
                             (char)((ulong)in_stack_fffffffffffff088 >> 0x38));
                location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
              }
              else if (((local_20->v1_1_0_add_escape_sequence_e & 1U) == 0) ||
                      (cVar1 = location::current((location *)in_stack_fffffffffffff088),
                      cVar1 != 'e')) {
                if (((local_20->v1_1_0_add_escape_sequence_x & 1U) == 0) ||
                   (cVar1 = location::current((location *)in_stack_fffffffffffff088), cVar1 != 'x'))
                {
                  cVar1 = location::current((location *)in_stack_fffffffffffff088);
                  if (cVar1 == 'u') {
                    character::character
                              ((character *)in_stack_fffffffffffff090,
                               (char_type)((ulong)in_stack_fffffffffffff088 >> 0x38));
                    loc_00._M_impl = (__impl *)local_4b0;
                    syntax::hexdig::hexdig
                              ((hexdig *)loc_00._M_impl,(spec *)in_stack_fffffffffffff0e8);
                    repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                              ((repeat_exact *)in_stack_fffffffffffff0b0,
                               (size_t)in_stack_fffffffffffff0a8,(hexdig *)in_stack_fffffffffffff0a0
                              );
                    sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                               (repeat_exact *)in_stack_fffffffffffff0a0);
                    repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffff090);
                    syntax::hexdig::~hexdig((hexdig *)in_stack_fffffffffffff090);
                    character::~character((character *)0x724c2a);
                    sequence::scan(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
                    bVar2 = region::is_ok((region *)0x724c56);
                    if (bVar2) {
                      parse_utf8_codepoint<toml::type_config>(in_stack_fffffffffffff6c8);
                      bVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                              ::is_err(&local_7d0);
                      if (bVar2) {
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::as_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                  *)0x724f83);
                        err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff0e8);
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                  *)in_stack_fffffffffffff090,
                                 (failure_type *)in_stack_fffffffffffff088);
                        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x724fb9);
                      }
                      else {
                        local_830 = &PTR_s__workspace_llm4binary_github_lic_00a5efb0;
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::unwrap(in_stack_fffffffffffff0e8,loc_00);
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff090,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff088);
                      }
                      local_380 = (uint)bVar2;
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                 *)0x72505f);
                    }
                    else {
                      region::region(in_stack_fffffffffffff100,
                                     (location *)CONCAT17(cVar1,in_stack_fffffffffffff0f8));
                      source_location::source_location
                                (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
                      region::~region((region *)in_stack_fffffffffffff090);
                      v = local_6c9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(in_stack_fffffffffffff0cf,
                                                  in_stack_fffffffffffff0c8),
                                 in_stack_fffffffffffff0c0);
                      source_location::source_location
                                (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(in_stack_fffffffffffff0cf,
                                                  in_stack_fffffffffffff0c8),
                                 in_stack_fffffffffffff0c0);
                      make_error_info<>((string *)in_stack_fffffffffffff258,
                                        in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                      err<toml::error_info>(v);
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                *)in_stack_fffffffffffff090,
                               (failure_type *)in_stack_fffffffffffff088);
                      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x724d6a);
                      error_info::~error_info((error_info *)in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      std::allocator<char>::~allocator(local_769);
                      source_location::~source_location(in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      std::allocator<char>::~allocator((allocator<char> *)local_6c9);
                      local_380 = 1;
                      source_location::~source_location(in_stack_fffffffffffff090);
                    }
                    region::~region((region *)in_stack_fffffffffffff090);
                    sequence::~sequence((sequence *)in_stack_fffffffffffff090);
                  }
                  else {
                    cVar3 = location::current((location *)in_stack_fffffffffffff088);
                    if (cVar3 != 'U') {
                      region::region(in_stack_fffffffffffff100,
                                     (location *)CONCAT17(cVar1,in_stack_fffffffffffff0f8));
                      source_location::source_location
                                (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
                      region::~region((region *)in_stack_fffffffffffff090);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(cVar3,in_stack_fffffffffffff0c8),
                                 in_stack_fffffffffffff0c0);
                      std::allocator<char>::~allocator(local_d21);
                      if ((local_20->v1_1_0_add_escape_sequence_e & 1U) != 0) {
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff090,&in_stack_fffffffffffff088->is_ok_);
                      }
                      if ((local_20->v1_1_0_add_escape_sequence_x & 1U) != 0) {
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff090,&in_stack_fffffffffffff088->is_ok_);
                      }
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090,&in_stack_fffffffffffff088->is_ok_);
                      in_stack_fffffffffffff090 = (source_location *)local_df9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(cVar3,in_stack_fffffffffffff0c8),
                                 in_stack_fffffffffffff0c0);
                      source_location::source_location
                                (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
                      std::__cxx11::string::string
                                (in_stack_fffffffffffff0d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(cVar3,in_stack_fffffffffffff0c8));
                      make_error_info<>((string *)in_stack_fffffffffffff258,
                                        in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                      f = &local_d80;
                      err<toml::error_info>((error_info *)in_stack_fffffffffffff0e8);
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                *)in_stack_fffffffffffff090,f);
                      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7257ef);
                      error_info::~error_info((error_info *)in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      source_location::~source_location(in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      std::allocator<char>::~allocator(local_df9);
                      local_380 = 1;
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      source_location::~source_location(in_stack_fffffffffffff090);
                      goto LAB_0072599f;
                    }
                    character::character
                              ((character *)in_stack_fffffffffffff090,
                               (char_type)((ulong)in_stack_fffffffffffff088 >> 0x38));
                    __a = local_8a0;
                    syntax::hexdig::hexdig
                              ((hexdig *)in_stack_fffffffffffff0f0._M_impl,
                               (spec *)in_stack_fffffffffffff0e8);
                    repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                              ((repeat_exact *)in_stack_fffffffffffff0b0,
                               (size_t)in_stack_fffffffffffff0a8,(hexdig *)in_stack_fffffffffffff0a0
                              );
                    sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                               (repeat_exact *)in_stack_fffffffffffff0a0);
                    repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffff090);
                    syntax::hexdig::~hexdig((hexdig *)in_stack_fffffffffffff090);
                    character::~character((character *)0x725169);
                    sequence::scan(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
                    bVar2 = region::is_ok((region *)0x725195);
                    if (bVar2) {
                      parse_utf8_codepoint<toml::type_config>(in_stack_fffffffffffff6c8);
                      bVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                              ::is_err(&local_bc0);
                      if (bVar2) {
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::as_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                  *)0x7254c2);
                        err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff0e8);
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                  *)in_stack_fffffffffffff090,
                                 (failure_type *)in_stack_fffffffffffff088);
                        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7254f8);
                      }
                      else {
                        local_c20 = &PTR_s__workspace_llm4binary_github_lic_00a5efc8;
                        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        ::unwrap(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0f0);
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff090,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff088);
                      }
                      local_380 = (uint)bVar2;
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                 *)0x72559e);
                    }
                    else {
                      region::region(in_stack_fffffffffffff100,
                                     (location *)CONCAT17(cVar1,in_stack_fffffffffffff0f8));
                      source_location::source_location
                                (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
                      region::~region((region *)in_stack_fffffffffffff090);
                      in_stack_fffffffffffff0b8 = local_ab9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(cVar3,in_stack_fffffffffffff0c8),__a);
                      source_location::source_location
                                (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff0d0,
                                 (char *)CONCAT17(cVar3,in_stack_fffffffffffff0c8),__a);
                      make_error_info<>((string *)in_stack_fffffffffffff258,
                                        in_stack_fffffffffffff250,in_stack_fffffffffffff248);
                      err<toml::error_info>((error_info *)in_stack_fffffffffffff0e8);
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                *)in_stack_fffffffffffff090,
                               (failure_type *)in_stack_fffffffffffff088);
                      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7252a9);
                      error_info::~error_info((error_info *)in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      std::allocator<char>::~allocator(local_b59);
                      source_location::~source_location(in_stack_fffffffffffff090);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090);
                      std::allocator<char>::~allocator((allocator<char> *)local_ab9);
                      local_380 = 1;
                      source_location::~source_location(in_stack_fffffffffffff090);
                    }
                    region::~region((region *)in_stack_fffffffffffff090);
                    sequence::~sequence((sequence *)in_stack_fffffffffffff090);
                  }
                }
                else {
                  character::character
                            ((character *)in_stack_fffffffffffff090,
                             (char_type)((ulong)in_stack_fffffffffffff088 >> 0x38));
                  syntax::hexdig::hexdig
                            ((hexdig *)in_stack_fffffffffffff0f0._M_impl,
                             (spec *)in_stack_fffffffffffff0e8);
                  repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                            ((repeat_exact *)in_stack_fffffffffffff0b0,
                             (size_t)in_stack_fffffffffffff0a8,(hexdig *)in_stack_fffffffffffff0a0);
                  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                             (repeat_exact *)in_stack_fffffffffffff0a0);
                  repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffff090);
                  syntax::hexdig::~hexdig((hexdig *)in_stack_fffffffffffff090);
                  character::~character((character *)0x7246d9);
                  sequence::scan(in_stack_fffffffffffff188,in_stack_fffffffffffff180);
                  bVar2 = region::is_ok((region *)0x724705);
                  if (bVar2) {
                    parse_utf8_codepoint<toml::type_config>(in_stack_fffffffffffff6c8);
                    bVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                            ::is_err(&local_3e0);
                    if (bVar2) {
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::as_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                *)0x724a44);
                      err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff0e8);
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                *)in_stack_fffffffffffff090,
                               (failure_type *)in_stack_fffffffffffff088);
                      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x724a7a);
                    }
                    else {
                      local_440 = &PTR_s__workspace_llm4binary_github_lic_00a5ef98;
                      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      ::unwrap(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0f0);
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff090,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff088);
                    }
                    local_380 = (uint)bVar2;
                    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                    ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                               *)0x724b20);
                  }
                  else {
                    region::region(in_stack_fffffffffffff100,
                                   (location *)
                                   CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8));
                    source_location::source_location
                              (in_stack_fffffffffffff110,in_stack_fffffffffffff108);
                    region::~region((region *)in_stack_fffffffffffff090);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff0d0,
                               (char *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8)
                               ,in_stack_fffffffffffff0c0);
                    source_location::source_location
                              (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff0d0,
                               (char *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8)
                               ,in_stack_fffffffffffff0c0);
                    make_error_info<>((string *)in_stack_fffffffffffff258,in_stack_fffffffffffff250,
                                      in_stack_fffffffffffff248);
                    err<toml::error_info>((error_info *)in_stack_fffffffffffff0e8);
                    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                    ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                              *)in_stack_fffffffffffff090,(failure_type *)in_stack_fffffffffffff088)
                    ;
                    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x72482b);
                    error_info::~error_info((error_info *)in_stack_fffffffffffff090);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff090);
                    std::allocator<char>::~allocator(local_379);
                    source_location::~source_location(in_stack_fffffffffffff090);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff090);
                    std::allocator<char>::~allocator(local_2d9);
                    local_380 = 1;
                    source_location::~source_location(in_stack_fffffffffffff090);
                  }
                  region::~region((region *)in_stack_fffffffffffff090);
                  sequence::~sequence((sequence *)in_stack_fffffffffffff090);
                }
                if (local_380 != 0) goto LAB_0072599f;
              }
              else {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff090,
                             (char)((ulong)in_stack_fffffffffffff088 >> 0x38));
                location::advance(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
              }
            }
          }
        }
      }
    }
  }
  ok<std::__cxx11::string&>(in_stack_fffffffffffff0b8);
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
            *)in_stack_fffffffffffff090,(success_type *)in_stack_fffffffffffff088);
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~success((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x72596f);
  local_380 = 1;
LAB_0072599f:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff090);
  return in_RDI;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_escape_sequence(location& loc, const context<TC>& ctx)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    const auto& spec = ctx.toml_spec();

    assert( ! loc.eof());
    assert(loc.current() == '\\');
    loc.advance(); // consume the first backslash

    string_type retval;

    if     (loc.current() == '\\') { retval += char_type('\\'); loc.advance(); }
    else if(loc.current() == '"')  { retval += char_type('\"'); loc.advance(); }
    else if(loc.current() == 'b')  { retval += char_type('\b'); loc.advance(); }
    else if(loc.current() == 'f')  { retval += char_type('\f'); loc.advance(); }
    else if(loc.current() == 'n')  { retval += char_type('\n'); loc.advance(); }
    else if(loc.current() == 'r')  { retval += char_type('\r'); loc.advance(); }
    else if(loc.current() == 't')  { retval += char_type('\t'); loc.advance(); }
    else if(spec.v1_1_0_add_escape_sequence_e && loc.current() == 'e')
    {
        retval += char_type('\x1b');
        loc.advance();
    }
    else if(spec.v1_1_0_add_escape_sequence_x && loc.current() == 'x')
    {
        auto scanner = sequence(character('x'), repeat_exact(2, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\xhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'u')
    {
        auto scanner = sequence(character('u'), repeat_exact(4, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\uhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'U')
    {
        auto scanner = sequence(character('U'), repeat_exact(8, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\Uhhhhhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else
    {
        auto src = source_location(region(loc));
        std::string escape_seqs = "allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t";
        if(spec.v1_1_0_add_escape_sequence_e)
        {
            escape_seqs += ", \\e";
        }
        if(spec.v1_1_0_add_escape_sequence_x)
        {
            escape_seqs += ", \\xhh";
        }
        escape_seqs += ", \\uhhhh, or \\Uhhhhhhhh";

        return err(make_error_info("toml::parse_escape_sequence: "
               "unknown escape sequence.", std::move(src), escape_seqs));
    }
    return ok(retval);
}